

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::BlockReferencedByShaderValidator::validate
          (BlockReferencedByShaderValidator *this,Program *program,string *resource,GLint propValue,
          string *implementationName)

{
  undefined1 *this_00;
  ostringstream *poVar1;
  Shader *shader;
  pointer pIVar2;
  uint uVar3;
  bool bVar4;
  __type _Var5;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar6;
  char *pcVar7;
  int blockNdx;
  long lVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  allocator<char> local_231;
  BlockReferencedByShaderValidator *local_230;
  uint local_224;
  Program *local_220;
  long local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string blockName;
  MessageBuilder local_1b0;
  
  local_224 = propValue;
  glu::parseVariableName_abi_cxx11_(&blockName,(glu *)(resource->_M_dataplus)._M_p,(char *)resource)
  ;
  this_00 = &(this->super_PropValidator).field_0x2c;
  bVar10 = false;
  local_230 = this;
  local_220 = program;
  for (lVar9 = 0; pvVar6 = ProgramInterfaceDefinition::Program::getShaders(program),
      lVar9 < (int)((ulong)((long)(pvVar6->
                                  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar6->
                                 super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar9 = lVar9 + 1) {
    pvVar6 = ProgramInterfaceDefinition::Program::getShaders(program);
    shader = (pvVar6->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
             )._M_impl.super__Vector_impl_data._M_start[lVar9];
    bVar4 = ProgramInterfaceDefinition::VariableSearchFilter::matchesFilter
                      ((VariableSearchFilter *)this_00,shader);
    if (bVar4) {
      lVar11 = 0;
      local_218 = lVar9;
      for (lVar8 = 0;
          pIVar2 = (shader->m_defaultBlock).interfaceBlocks.
                   super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                   _M_impl.super__Vector_impl_data._M_start, lVar9 = local_218, program = local_220,
          lVar8 < (int)(((long)(shader->m_defaultBlock).interfaceBlocks.
                               super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) / 0x90);
          lVar8 = lVar8 + 1) {
        bVar4 = ProgramInterfaceDefinition::VariableSearchFilter::matchesFilter
                          ((VariableSearchFilter *)this_00,
                           (InterfaceBlock *)((long)&(pIVar2->layout).location + lVar11));
        if ((bVar4) &&
           (_Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&(pIVar2->interfaceName)._M_dataplus._M_p + lVar11),
                                    &blockName), _Var5)) {
          bVar10 = true;
        }
        lVar11 = lVar11 + 0x90;
      }
    }
  }
  local_1b0.m_log = ((local_230->super_PropValidator).m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Verifying referenced by ");
  pcVar7 = glu::getShaderTypeName(local_230->m_shaderType);
  std::operator<<((ostream *)poVar1,pcVar7);
  std::operator<<((ostream *)poVar1," shader, expecting ");
  pcVar7 = "GL_FALSE";
  if (bVar10) {
    pcVar7 = "GL_TRUE";
  }
  std::operator<<((ostream *)poVar1,pcVar7);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  uVar3 = local_224;
  if (bVar10 != local_224) {
    local_1b0.m_log = ((local_230->super_PropValidator).m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"\tError, invalid referenced_by_");
    pcVar7 = glu::getShaderTypeName(local_230->m_shaderType);
    std::operator<<((ostream *)poVar1,pcVar7);
    std::operator<<((ostream *)poVar1,", got ");
    std::ostream::operator<<(poVar1,uVar3);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    pcVar7 = glu::getShaderTypeName(local_230->m_shaderType);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,pcVar7,&local_231);
    std::operator+(&local_1f0,"referenced_by_",&local_210);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   &local_1f0," invalid");
    PropValidator::setError(&local_230->super_PropValidator,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  std::__cxx11::string::~string((string *)&blockName);
  return;
}

Assistant:

void BlockReferencedByShaderValidator::validate (const ProgramInterfaceDefinition::Program* program, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const std::string	blockName			= glu::parseVariableName(resource.c_str());
	bool				referencedByShader	= false;

	DE_UNREF(implementationName);

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* const shader = program->getShaders()[shaderNdx];
		if (!m_filter.matchesFilter(shader))
			continue;

		for (int blockNdx = 0; blockNdx < (int)shader->getDefaultBlock().interfaceBlocks.size(); ++blockNdx)
		{
			const glu::InterfaceBlock& block = shader->getDefaultBlock().interfaceBlocks[blockNdx];

			if (m_filter.matchesFilter(block) && block.interfaceName == blockName)
				referencedByShader = true;
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying referenced by " << glu::getShaderTypeName(m_shaderType) << " shader, expecting "
		<< ((referencedByShader) ? ("GL_TRUE") : ("GL_FALSE"))
		<< tcu::TestLog::EndMessage;

	if (propValue != ((referencedByShader) ? (1) : (0)))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid referenced_by_" << glu::getShaderTypeName(m_shaderType) << ", got " << propValue << tcu::TestLog::EndMessage;
		setError("referenced_by_" + std::string(glu::getShaderTypeName(m_shaderType)) + " invalid");
	}
}